

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

void __thiscall
Win32MakefileGenerator::writeStandardParts(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  long lVar2;
  QString string;
  QString string_00;
  QString file;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  QTextStream *pQVar7;
  QTextStream *pQVar8;
  ProStringList *pPVar9;
  undefined8 uVar10;
  QMovableArrayOps<ProString> *this_00;
  QTextStream *pQVar11;
  ProStringList *pPVar12;
  ProStringList *paths;
  ProString *pPVar13;
  ProString *pPVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QStringView config;
  undefined8 in_stack_fffffffffffffdf8;
  undefined1 local_1c8 [48];
  ProKey local_198;
  QStringBuilder<ProString,_ProString> local_168;
  QString local_108;
  QArrayDataPointer<QString> local_e8;
  undefined1 local_c8 [32];
  ProString local_a8;
  undefined1 local_78 [32];
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::writeExportedVariables(&this->super_MakefileGenerator,t);
  QTextStream::operator<<(t,"####### Compiler, tools and options\n\n");
  pQVar7 = (QTextStream *)QTextStream::operator<<(t,"CC            = ");
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_CC");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_168);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_a8);
  Qt::endl(pQVar7);
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar7 = (QTextStream *)QTextStream::operator<<(t,"CXX           = ");
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_CXX");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_168);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_a8);
  Qt::endl(pQVar7);
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar7 = (QTextStream *)QTextStream::operator<<(t,"DEFINES       = ");
  ProKey::ProKey((ProKey *)&local_168,"PRL_EXPORT_DEFINES");
  QVar15.m_data = (storage_type *)0x2;
  QVar15.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar15);
  QVar16.m_data = (storage_type *)0x3;
  QVar16.m_size = (qsizetype)&local_a8;
  pPVar14 = (ProString *)local_a8.m_string.d.d;
  QString::fromUtf8(QVar16);
  local_58.d = (Data *)local_a8.m_string.d.d;
  local_58.ptr = (ProString *)local_a8.m_string.d.ptr;
  local_58.size = local_a8.m_string.d.size;
  QVar17.m_data = (storage_type *)0x1;
  QVar17.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar17);
  local_78._0_8_ = local_a8.m_string.d.d;
  local_78._8_8_ = local_a8.m_string.d.ptr;
  local_78._16_8_ = local_a8.m_string.d.size;
  MakefileGenerator::varGlue
            ((QString *)local_1c8,&this->super_MakefileGenerator,(ProKey *)&local_168,
             (QString *)&stack0xfffffffffffffe08,(QString *)&local_58,(QString *)local_78);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_1c8);
  ProKey::ProKey((ProKey *)&local_a8,"DEFINES");
  QVar18.m_data = (storage_type *)0x2;
  QVar18.m_size = (qsizetype)&local_198;
  QString::fromUtf8(QVar18);
  local_c8._0_8_ = local_198.super_ProString.m_string.d.d;
  local_c8._8_8_ = local_198.super_ProString.m_string.d.ptr;
  local_c8._16_8_ = local_198.super_ProString.m_string.d.size;
  QVar19.m_data = (storage_type *)0x3;
  QVar19.m_size = (qsizetype)&local_198;
  QString::fromUtf8(QVar19);
  local_e8.d = (Data *)local_198.super_ProString.m_string.d.d;
  local_e8.ptr = (QString *)local_198.super_ProString.m_string.d.ptr;
  local_e8.size = local_198.super_ProString.m_string.d.size;
  QVar20.m_data = (storage_type *)0x0;
  QVar20.m_size = (qsizetype)&local_198;
  QString::fromUtf8(QVar20);
  local_108.d.d = local_198.super_ProString.m_string.d.d;
  local_108.d.ptr = local_198.super_ProString.m_string.d.ptr;
  local_108.d.size = local_198.super_ProString.m_string.d.size;
  MakefileGenerator::varGlue
            ((QString *)&local_198,&this->super_MakefileGenerator,(ProKey *)&local_a8,
             (QString *)local_c8,(QString *)&local_e8,&local_108);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_198);
  Qt::endl(pQVar7);
  if ((Data *)local_198.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((Data *)local_108.d.d != (Data *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar7 = t;
  if ((Data *)local_e8.d != (Data *)0x0) {
    LOCK();
    ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((Data *)local_c8._0_8_ != (Data *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_1c8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_1c8._0_8_)->d).d = *(int *)&(((QString *)local_1c8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_1c8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_78._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_78._0_8_)->d).d = *(int *)&(((QString *)local_78._0_8_)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_58.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  if (pPVar14 != (ProString *)0x0) {
    LOCK();
    *(int *)&(pPVar14->m_string).d.d = *(int *)&(pPVar14->m_string).d.d + -1;
    UNLOCK();
    if (*(int *)&(pPVar14->m_string).d.d == 0) {
      QArrayData::deallocate((QArrayData *)pPVar14,2,0x10);
    }
  }
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)QTextStream::operator<<(t,"CFLAGS        = ");
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_CFLAGS");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_168);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
  QTextStream::operator<<(pQVar8," $(DEFINES)\n");
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)QTextStream::operator<<(t,"CXXFLAGS      = ");
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_CXXFLAGS");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_a8,this,&local_168);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
  QTextStream::operator<<(pQVar8," $(DEFINES)\n");
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x23])
            (this,t);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x24])
            (this,t);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[6])(this,t);
  Qt::endl(t);
  QTextStream::operator<<(t,"####### Output directory\n\n");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"OBJECTS_DIR");
  pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
  lVar2 = (pPVar9->super_QList<ProString>).d.size;
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar2 == 0) {
    QTextStream::operator<<(t,"OBJECTS_DIR   = . \n");
  }
  else {
    pQVar8 = (QTextStream *)QTextStream::operator<<(t,"OBJECTS_DIR   = ");
    ProKey::ProKey((ProKey *)&local_168,"OBJECTS_DIR");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              ((QRegularExpression *)&local_198,this,&local_168);
    QVar21.m_data = (storage_type *)0x3;
    QVar21.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar21);
    local_1c8._0_8_ = local_a8.m_string.d.d;
    local_1c8._8_8_ = local_a8.m_string.d.ptr;
    local_1c8._16_8_ = local_a8.m_string.d.size;
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)&stack0xfffffffffffffe08,local_1c8,0);
    local_a8.m_string.d.d = (Data *)0x0;
    local_a8.m_string.d.ptr = (char16_t *)0x0;
    local_a8.m_string.d.size = 0;
    uVar10 = QString::replace((QRegularExpression *)&local_198,(QString *)&stack0xfffffffffffffe08);
    if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (&local_a8,this,uVar10);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_a8);
    Qt::endl(pQVar8);
    if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QRegularExpression::~QRegularExpression((QRegularExpression *)&stack0xfffffffffffffe08);
    if ((ProString *)local_1c8._0_8_ != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)local_1c8._0_8_)->d).d =
           *(int *)&(((QString *)local_1c8._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_1c8._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
      }
    }
    if ((Data *)local_198.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  Qt::endl(t);
  QTextStream::operator<<(t,"####### Files\n\n");
  pQVar8 = (QTextStream *)QTextStream::operator<<(t,"SOURCES       = ");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"SOURCES");
  pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
  MakefileGenerator::escapeFilePaths
            ((ProStringList *)local_1c8,&this->super_MakefileGenerator,pPVar9);
  MakefileGenerator::valList
            ((QString *)&local_198,&this->super_MakefileGenerator,(ProStringList *)local_1c8);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_198);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8," ");
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_a8,"GENERATED_SOURCES");
  pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_a8);
  MakefileGenerator::escapeFilePaths
            ((ProStringList *)&local_58,&this->super_MakefileGenerator,pPVar9);
  MakefileGenerator::valList
            ((QString *)&stack0xfffffffffffffe08,&this->super_MakefileGenerator,
             (ProStringList *)&local_58);
  pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&stack0xfffffffffffffe08);
  Qt::endl(pQVar8);
  if (pPVar14 != (ProString *)0x0) {
    LOCK();
    *(int *)&(pPVar14->m_string).d.d = *(int *)&(pPVar14->m_string).d.d + -1;
    UNLOCK();
    if (*(int *)&(pPVar14->m_string).d.d == 0) {
      QArrayData::deallocate((QArrayData *)pPVar14,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((Data *)local_198.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_1c8);
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)&local_168,"DESTDIR");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (&local_58,this,&local_168);
  if (&(local_168.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_168.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_168.a.m_string.d.d = (Data *)local_58.d;
  local_168.a.m_string.d.ptr = (char16_t *)local_58.ptr;
  local_168.a.m_string.d.size = local_58.size;
  if ((ProString *)local_58.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d + 1;
    UNLOCK();
  }
  string.d.ptr = (char16_t *)pQVar7;
  string.d.d = (Data *)in_stack_fffffffffffffdf8;
  string.d.size = (qsizetype)pPVar14;
  Option::fixString((QString *)local_78,string,(uchar)&local_168);
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_78._16_8_ != (undefined1 *)0x0) {
    cVar4 = QString::endsWith((QChar)(char16_t)&local_58,0x2f);
    if (cVar4 == '\0') {
      cVar4 = QString::endsWith((QString *)&local_58,0x2e5bf0);
      if (cVar4 == '\0') goto LAB_0025d71f;
    }
    QString::append((QString *)local_78);
  }
LAB_0025d71f:
  local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_198,"TARGET");
  QMakeEvaluator::first(&local_a8,&pQVar1->super_QMakeEvaluator,&local_198);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&stack0xfffffffffffffe08,"TARGET_EXT");
  QMakeEvaluator::first
            ((ProString *)local_1c8,&pQVar1->super_QMakeEvaluator,(ProKey *)&stack0xfffffffffffffe08
            );
  ProString::ProString(&local_168.a,&local_a8);
  ProString::ProString(&local_168.b,(ProString *)local_1c8);
  QStringBuilder<ProString,_ProString>::convertTo<QString>((QString *)local_c8,&local_168);
  QStringBuilder<ProString,_ProString>::~QStringBuilder(&local_168);
  if ((ProString *)local_1c8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_1c8._0_8_)->d).d = *(int *)&(((QString *)local_1c8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_1c8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
    }
  }
  pQVar8 = pQVar7;
  if (pPVar14 != (ProString *)0x0) {
    LOCK();
    *(int *)&(pPVar14->m_string).d.d = *(int *)&(pPVar14->m_string).d.d + -1;
    UNLOCK();
    if (*(int *)&(pPVar14->m_string).d.d == 0) {
      QArrayData::deallocate((QArrayData *)pPVar14,2,0x10);
    }
  }
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((Data *)local_198.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"DEST_TARGET");
  this_00 = (QMovableArrayOps<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
  local_198.super_ProString.m_string.d.d = (Data *)local_78;
  local_198.super_ProString.m_string.d.ptr = (char16_t *)local_c8;
  ProString::ProString<QString&,QString&>
            (&local_a8,(QStringBuilder<QString_&,_QString_&> *)&local_198);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>(this_00,0,&local_a8);
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x25])
            (this,pQVar7);
  MakefileGenerator::writeExtraCompilerVariables(&this->super_MakefileGenerator,pQVar7);
  MakefileGenerator::writeExtraVariables(&this->super_MakefileGenerator,pQVar7);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar7,"DIST          = ");
  ProKey::ProKey((ProKey *)&local_168,"DISTFILES");
  MakefileGenerator::fileVarList
            ((QString *)local_1c8,&this->super_MakefileGenerator,(ProKey *)&local_168);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)local_1c8);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,' ');
  ProKey::ProKey((ProKey *)&local_a8,"HEADERS");
  MakefileGenerator::fileVarList
            ((QString *)&stack0xfffffffffffffe08,&this->super_MakefileGenerator,(ProKey *)&local_a8)
  ;
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&stack0xfffffffffffffe08);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,' ');
  ProKey::ProKey(&local_198,"SOURCES");
  MakefileGenerator::fileVarList((QString *)&local_e8,&this->super_MakefileGenerator,&local_198);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_e8);
  Qt::endl(pQVar11);
  if ((Data *)local_e8.d != (Data *)0x0) {
    LOCK();
    ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_198.super_ProString.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->d).d +
         -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->d).d ==
        0) {
      QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pPVar14 != (ProString *)0x0) {
    LOCK();
    *(int *)&(pPVar14->m_string).d.d = *(int *)&(pPVar14->m_string).d.d + -1;
    UNLOCK();
    if (*(int *)&(pPVar14->m_string).d.d == 0) {
      QArrayData::deallocate((QArrayData *)pPVar14,2,0x10);
    }
  }
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_1c8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_1c8._0_8_)->d).d = *(int *)&(((QString *)local_1c8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_1c8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar7,"QMAKE_TARGET  = ");
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_ORIG_TARGET");
  MakefileGenerator::fileVar(&local_a8.m_string,&this->super_MakefileGenerator,(ProKey *)&local_168)
  ;
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_a8);
  Qt::endl(pQVar11);
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar7,"DESTDIR        = ");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (&local_168,this,local_78);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_168);
  QTextStream::operator<<(pQVar11," #avoid trailing-slash linebreak\n");
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar7,"TARGET         = ");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (&local_168,this,local_c8);
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_168);
  Qt::endl(pQVar11);
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar7,"DESTDIR_TARGET = ");
  ProKey::ProKey((ProKey *)&local_168,"DEST_TARGET");
  MakefileGenerator::fileVar(&local_a8.m_string,&this->super_MakefileGenerator,(ProKey *)&local_168)
  ;
  pQVar11 = (QTextStream *)QTextStream::operator<<(pQVar11,(QString *)&local_a8);
  Qt::endl(pQVar11);
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  Qt::endl(pQVar7);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x26])
            (this,pQVar7);
  QTextStream::operator<<(pQVar7,"####### Build rules\n\n");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x27])
            (this,pQVar7);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_a8,"TEMPLATE");
  QMakeEvaluator::first(&local_168.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_a8);
  bVar5 = ProString::operator==(&local_168.a,"aux");
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar22.m_data = (storage_type *)0x6;
    QVar22.m_size = (qsizetype)&local_168;
    QString::fromUtf8(QVar22);
    pDVar3 = local_168.a.m_string.d.d;
    bVar5 = false;
    config.m_data = local_168.a.m_string.d.ptr;
    config.m_size = local_168.a.m_string.d.size;
    bVar6 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    pQVar7 = pQVar8;
    if (bVar6) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_168,"DLLDESTDIR");
      pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
      bVar5 = (pPVar9->super_QList<ProString>).d.size != 0;
      pQVar7 = pQVar8;
      if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
          pQVar7 = pQVar8;
        }
      }
    }
    if ((ProString *)pDVar3 != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
           *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
    if (bVar5) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_168,"DLLDESTDIR");
      pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
      if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((pPVar9->super_QList<ProString>).d.size != 0) {
        pPVar13 = (pPVar9->super_QList<ProString>).d.ptr;
        do {
          pQVar8 = (QTextStream *)
                   QTextStream::operator<<(pQVar7,"\t-$(COPY_FILE) $(DESTDIR_TARGET) ");
          ProString::toQString((QString *)&local_198,pPVar13);
          local_168.a.m_string.d.d = local_198.super_ProString.m_string.d.d;
          local_168.a.m_string.d.ptr = local_198.super_ProString.m_string.d.ptr;
          local_168.a.m_string.d.size = local_198.super_ProString.m_string.d.size;
          if ((ProString *)local_198.super_ProString.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->d).d
                 = *(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData
                             )->d).d + 1;
            UNLOCK();
          }
          string_00.d.ptr = (char16_t *)pQVar7;
          string_00.d.d = (Data *)in_stack_fffffffffffffdf8;
          string_00.d.size = (qsizetype)pPVar14;
          Option::fixString(&local_a8.m_string,string_00,(uchar)&local_168);
          if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc]
          )(&local_168,this,&local_a8);
          pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_168);
          Qt::endl(pQVar8);
          if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((ProString *)local_198.super_ProString.m_string.d.d != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->d).d
                 = *(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData
                             )->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->
                         d).d == 0) {
              QArrayData::deallocate
                        (&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          pPVar13 = pPVar13 + 1;
        } while (pPVar13 !=
                 (pPVar9->super_QList<ProString>).d.ptr + (pPVar9->super_QList<ProString>).d.size);
      }
    }
    pQVar8 = pQVar7;
    Qt::endl(pQVar7);
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x28])
              (this,pQVar7);
  }
  MakefileGenerator::writeMakeQmake(&this->super_MakefileGenerator,pQVar7,false);
  local_198.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_198.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_198.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  MakefileGenerator::fileFixify
            ((QStringList *)&local_198,&this->super_MakefileGenerator,&Option::mkfile::project_files
             ,(FileFixifyTypes)0x0,true);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_INTERNAL_INCLUDED_FILES");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_168);
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_168,"QMAKE_INTERNAL_INCLUDED_FILES");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
    ProStringList::toQStringList((QStringList *)&local_a8,pPVar9);
    QList<QString>::operator+=((QList<QString> *)&local_198,(QList<QString> *)&local_a8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
    if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"TRANSLATIONS");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_168);
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    ProKey::ProKey((ProKey *)&local_168,"TRANSLATIONS");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_a8,this,&local_168);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_198,local_198.super_ProString.m_string.d.size,
               &local_a8.m_string);
    QList<QString>::end((QList<QString> *)&local_198);
    if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"FORMS");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_168);
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_168,"FORMS");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
    if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((pPVar9->super_QList<ProString>).d.size != 0) {
      pPVar13 = (pPVar9->super_QList<ProString>).d.ptr;
      do {
        local_a8.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8._8_8_ = QList<QString>::begin(&Option::h_ext);
        local_1c8._0_8_ = pPVar13;
        QStringBuilder<const_ProString_&,_QString_&>::convertTo<QString>
                  ((QString *)&local_168,(QStringBuilder<const_ProString_&,_QString_&> *)local_1c8);
        MakefileGenerator::fileFixify
                  (&local_a8.m_string,&this->super_MakefileGenerator,(QString *)&local_168,
                   (FileFixifyTypes)0x0,true);
        if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pDVar3 = local_a8.m_string.d.d;
        if ((ProString *)local_a8.m_string.d.d == (ProString *)0x0) {
          local_168.a.m_string.d.d = (Data *)0x0;
        }
        else {
          LOCK();
          *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + 1;
          UNLOCK();
          local_168.a.m_string.d.d = local_a8.m_string.d.d;
          LOCK();
          *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + 1;
          UNLOCK();
        }
        local_168.a.m_string.d.size = local_a8.m_string.d.size;
        local_168.a.m_string.d.ptr = local_a8.m_string.d.ptr;
        file.d.ptr = (char16_t *)pQVar8;
        file.d.d = (Data *)pPVar9;
        file.d.size = (qsizetype)pPVar14;
        MakefileGenerator::fileInfo((MakefileGenerator *)local_1c8,file);
        cVar4 = QFileInfo::exists();
        QFileInfo::~QFileInfo((QFileInfo *)local_1c8);
        if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((ProString *)pDVar3 != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d =
               *(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&pDVar3->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        if (cVar4 != '\0') {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_198,
                     local_198.super_ProString.m_string.d.size,&local_a8.m_string);
          QList<QString>::end((QList<QString> *)&local_198);
        }
        if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pPVar13 = pPVar13 + 1;
      } while (pPVar13 !=
               (pPVar9->super_QList<ProString>).d.ptr + (pPVar9->super_QList<ProString>).d.size);
    }
  }
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar8,"dist:\n\t");
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,"$(ZIP) ");
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_ORIG_TARGET");
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
            (local_1c8,this,&local_168);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)local_1c8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,".zip $(SOURCES) $(DIST) ");
  MakefileGenerator::escapeFilePaths
            ((QStringList *)&local_e8,&this->super_MakefileGenerator,(QStringList *)&local_198);
  local_a8.m_string.d.d = (Data *)CONCAT62(local_a8.m_string.d.d._2_6_,0x20);
  QtPrivate::QStringList_join
            ((QList *)&stack0xfffffffffffffe08,(QChar *)&local_e8,(longlong)&local_a8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&stack0xfffffffffffffe08);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,' ');
  ProKey::ProKey((ProKey *)&local_a8,"TRANSLATIONS");
  MakefileGenerator::fileVar(&local_108,&this->super_MakefileGenerator,(ProKey *)&local_a8);
  pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar7,(QString *)&local_108);
  QTextStream::operator<<(pQVar7,' ');
  if ((Data *)local_108.d.d != (Data *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((ProString *)local_a8.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_a8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pPVar14 != (ProString *)0x0) {
    LOCK();
    *(int *)&(pPVar14->m_string).d.d = *(int *)&(pPVar14->m_string).d.d + -1;
    UNLOCK();
    if (*(int *)&(pPVar14->m_string).d.d == 0) {
      QArrayData::deallocate((QArrayData *)pPVar14,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
  if ((ProString *)local_1c8._0_8_ != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)local_1c8._0_8_)->d).d = *(int *)&(((QString *)local_1c8._0_8_)->d).d + -1
    ;
    UNLOCK();
    if (*(int *)&(((QString *)local_1c8._0_8_)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_168,"QMAKE_EXTRA_COMPILERS");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_168);
  if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar5) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)&local_168,"QMAKE_EXTRA_COMPILERS");
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
    if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((pPVar9->super_QList<ProString>).d.size != 0) {
      pPVar14 = (pPVar9->super_QList<ProString>).d.ptr;
      do {
        pQVar1 = (this->super_MakefileGenerator).project;
        local_a8.m_string.d.ptr = L".input";
        local_a8.m_string.d.d = (Data *)pPVar14;
        ProString::ProString<ProString_const&,char_const(&)[7]>
                  (&local_168.a,(QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_a8);
        pPVar12 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_168);
        if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((pPVar12->super_QList<ProString>).d.size != 0) {
          pPVar13 = (pPVar12->super_QList<ProString>).d.ptr;
          do {
            paths = QMakeEvaluator::valuesRef
                              (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,
                               (ProKey *)pPVar13);
            MakefileGenerator::escapeFilePaths
                      ((ProStringList *)&local_a8,&this->super_MakefileGenerator,paths);
            ProStringList::join((QString *)&local_168,(ProStringList *)&local_a8,(QChar)0x20);
            pQVar7 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_168);
            QTextStream::operator<<(pQVar7,' ');
            if ((ProString *)local_168.a.m_string.d.d != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_168.a.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_168.a.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            QArrayDataPointer<ProString>::~QArrayDataPointer
                      ((QArrayDataPointer<ProString> *)&local_a8);
            pPVar13 = pPVar13 + 1;
          } while (pPVar13 !=
                   (pPVar12->super_QList<ProString>).d.ptr +
                   (pPVar12->super_QList<ProString>).d.size);
        }
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 !=
               (pPVar9->super_QList<ProString>).d.ptr + (pPVar9->super_QList<ProString>).d.size);
    }
  }
  pQVar7 = (QTextStream *)Qt::endl(pQVar8);
  Qt::endl(pQVar7);
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x21])
            (this,pQVar8);
  MakefileGenerator::writeExtraTargets(&this->super_MakefileGenerator,pQVar8);
  MakefileGenerator::writeExtraCompilerTargets(&this->super_MakefileGenerator,pQVar8);
  pQVar7 = (QTextStream *)Qt::endl(pQVar8);
  Qt::endl(pQVar7);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_198);
  if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if ((ProString *)local_58.d != (ProString *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_58.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeStandardParts(QTextStream &t)
{
    writeExportedVariables(t);

    t << "####### Compiler, tools and options\n\n";
    t << "CC            = " << var("QMAKE_CC") << Qt::endl;
    t << "CXX           = " << var("QMAKE_CXX") << Qt::endl;
    t << "DEFINES       = "
      << varGlue("PRL_EXPORT_DEFINES","-D"," -D"," ")
      << varGlue("DEFINES","-D"," -D","") << Qt::endl;
    t << "CFLAGS        = " << var("QMAKE_CFLAGS") << " $(DEFINES)\n";
    t << "CXXFLAGS      = " << var("QMAKE_CXXFLAGS") << " $(DEFINES)\n";

    writeIncPart(t);
    writeLibsPart(t);
    writeDefaultVariables(t);
    t << Qt::endl;

    t << "####### Output directory\n\n";
    if(!project->values("OBJECTS_DIR").isEmpty())
        t << "OBJECTS_DIR   = " << escapeFilePath(var("OBJECTS_DIR").remove(QRegularExpression("\\\\$"))) << Qt::endl;
    else
        t << "OBJECTS_DIR   = . \n";
    t << Qt::endl;

    t << "####### Files\n\n";
    t << "SOURCES       = " << valList(escapeFilePaths(project->values("SOURCES")))
      << " " << valList(escapeFilePaths(project->values("GENERATED_SOURCES"))) << Qt::endl;

    // do this here so we can set DEST_TARGET to be the complete path to the final target if it is needed.
    QString orgDestDir = var("DESTDIR");
    QString destDir = Option::fixPathToTargetOS(orgDestDir, false);
    if (!destDir.isEmpty() && (orgDestDir.endsWith('/') || orgDestDir.endsWith(Option::dir_sep)))
        destDir += Option::dir_sep;
    QString target = QString(project->first("TARGET")+project->first("TARGET_EXT"));
    project->values("DEST_TARGET").prepend(destDir + target);

    writeObjectsPart(t);

    writeExtraCompilerVariables(t);
    writeExtraVariables(t);

    t << "DIST          = " << fileVarList("DISTFILES") << ' '
      << fileVarList("HEADERS") << ' ' << fileVarList("SOURCES") << Qt::endl;
    t << "QMAKE_TARGET  = " << fileVar("QMAKE_ORIG_TARGET") << Qt::endl;  // unused
    // The comment is important to maintain variable compatibility with Unix
    // Makefiles, while not interpreting a trailing-slash as a linebreak
    t << "DESTDIR        = " << escapeFilePath(destDir) << " #avoid trailing-slash linebreak\n";
    t << "TARGET         = " << escapeFilePath(target) << Qt::endl;
    t << "DESTDIR_TARGET = " << fileVar("DEST_TARGET") << Qt::endl;
    t << Qt::endl;

    writeImplicitRulesPart(t);

    t << "####### Build rules\n\n";
    writeBuildRulesPart(t);

    if (project->first("TEMPLATE") != "aux") {
        if (project->isActiveConfig("shared") && !project->values("DLLDESTDIR").isEmpty()) {
            const ProStringList &dlldirs = project->values("DLLDESTDIR");
            for (ProStringList::ConstIterator dlldir = dlldirs.begin(); dlldir != dlldirs.end(); ++dlldir) {
                t << "\t-$(COPY_FILE) $(DESTDIR_TARGET) "
                  << escapeFilePath(Option::fixPathToTargetOS((*dlldir).toQString(), false)) << Qt::endl;
            }
        }
        t << Qt::endl;

        writeRcFilePart(t);
    }

    writeMakeQmake(t);

    QStringList dist_files = fileFixify(Option::mkfile::project_files);
    if(!project->isEmpty("QMAKE_INTERNAL_INCLUDED_FILES"))
        dist_files += project->values("QMAKE_INTERNAL_INCLUDED_FILES").toQStringList();
    if(!project->isEmpty("TRANSLATIONS"))
        dist_files << var("TRANSLATIONS");
    if(!project->isEmpty("FORMS")) {
        const ProStringList &forms = project->values("FORMS");
        for (ProStringList::ConstIterator formit = forms.begin(); formit != forms.end(); ++formit) {
            QString ui_h = fileFixify((*formit) + Option::h_ext.first());
            if(exists(ui_h))
                dist_files << ui_h;
        }
    }
    t << "dist:\n\t"
      << "$(ZIP) " << var("QMAKE_ORIG_TARGET") << ".zip $(SOURCES) $(DIST) "
      << escapeFilePaths(dist_files).join(' ') << ' ' << fileVar("TRANSLATIONS") << ' ';
    if(!project->isEmpty("QMAKE_EXTRA_COMPILERS")) {
        const ProStringList &quc = project->values("QMAKE_EXTRA_COMPILERS");
        for (ProStringList::ConstIterator it = quc.begin(); it != quc.end(); ++it) {
            const ProStringList &inputs = project->values(ProKey(*it + ".input"));
            for (ProStringList::ConstIterator input = inputs.begin(); input != inputs.end(); ++input) {
                const ProStringList &val = project->values((*input).toKey());
                t << escapeFilePaths(val).join(' ') << ' ';
            }
        }
    }
    t << Qt::endl << Qt::endl;

    writeCleanParts(t);
    writeExtraTargets(t);
    writeExtraCompilerTargets(t);
    t << Qt::endl << Qt::endl;
}